

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O3

void print_tables(ip_tables_t *ipts)

{
  ip_table_t *piVar1;
  char *pcVar2;
  int i;
  long lVar3;
  int i_1;
  long lVar4;
  list_head *plVar5;
  
  if (ipts != (ip_tables_t *)0x0) {
    lVar3 = 0;
    do {
      if (ipts->tables[lVar3] != (ip_table_t *)0x0) {
        puts("==================================================");
        pcVar2 = map_int_get_k((int)lVar3,m_table);
        printf("Table %s\n",pcVar2);
        piVar1 = ipts->tables[lVar3];
        lVar4 = 0;
        do {
          if (piVar1->chains[lVar4] != (ip_chain_t *)0x0) {
            print_chain(piVar1->chains[lVar4]);
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 != 5);
        for (plVar5 = (piVar1->child_chains).next; plVar5 != &piVar1->child_chains;
            plVar5 = plVar5->next) {
          print_chain((ip_chain_t *)&plVar5[-3].prev);
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    puts("==================================================");
    return;
  }
  return;
}

Assistant:

void print_tables(ip_tables_t *ipts)
{
	if (ipts == NULL) {
		return;
	}

	for (int i = 0; i < TABLE_MAX; i++) {
		if (ipts->tables[i] != NULL) {
			printf("==================================================\n");
			printf("Table %s\n", map_int_get_k(i, m_table));
			print_table(ipts->tables[i]);
		}
	}

	printf("==================================================\n");
}